

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O1

void daccontrol_set_frequency(void *info,UINT32 Frequency)

{
  if (-1 < *(char *)((long)info + 0x7c)) {
    *(UINT32 *)((long)info + 0x5c) = Frequency;
    *(ulong *)((long)info + 0x80) =
         CONCAT44(Frequency,*(uint *)((long)info + 0x58) >> 1) / (ulong)*(uint *)((long)info + 0x58)
    ;
  }
  return;
}

Assistant:

void daccontrol_set_frequency(void* info, UINT32 Frequency)
{
	dac_control* chip = (dac_control*)info;
	
	if (chip->Running & 0x80)
		return;
	
	chip->Frequency = Frequency;
	RC_SET_RATIO(&chip->stepCntr, chip->Frequency, chip->sampleRate);
	
	return;
}